

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O3

ImageT<unsigned_char,_1U> * __thiscall
ImageT<unsigned_char,_1U>::normalize(ImageT<unsigned_char,_1U> *this)

{
  uint uVar1;
  ulong uVar2;
  
  uVar1 = (this->super_Image).height * (this->super_Image).width;
  if (uVar1 != 0) {
    uVar2 = 0;
    do {
      if ((anon_union_1_2_6556a7fb_for_color<unsigned_char,_1U>_3)
          this->pixels[uVar2].field_0.comps[0] !=
          (anon_union_1_2_6556a7fb_for_color<unsigned_char,_1U>_3)0x0) {
        this->pixels[uVar2].field_0 = (anon_union_1_2_6556a7fb_for_color<unsigned_char,_1U>_3)0xff;
      }
      uVar2 = uVar2 + 1;
    } while (uVar1 != uVar2);
  }
  return this;
}

Assistant:

virtual ImageT& normalize() override {
        uint32_t pixelCount = getPixelCount();
        for (uint32_t i = 0; i < pixelCount; ++i) {
            Color& c = pixels[i];
            c.normalize();
        }
        return *this;
    }